

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

lua_State * getthread(lua_State *L,int *arg)

{
  int *arg_local;
  lua_State *L_local;
  
  if ((L->base < L->top) && ((int)(L->base->field_4).it >> 0xf == -7)) {
    *arg = 1;
    L_local = (lua_State *)(L->base->u64 & 0x7fffffffffff);
  }
  else {
    *arg = 0;
    L_local = L;
  }
  return L_local;
}

Assistant:

static lua_State *getthread(lua_State *L, int *arg)
{
  if (L->base < L->top && tvisthread(L->base)) {
    *arg = 1;
    return threadV(L->base);
  } else {
    *arg = 0;
    return L;
  }
}